

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_UuidIndex>::Append(ON_SimpleArray<ON_UuidIndex> *this,ON_UuidIndex *x)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint uVar4;
  ON_UuidIndex *pOVar5;
  ON_UuidIndex *pOVar6;
  uint uVar7;
  
  uVar4 = this->m_count;
  pOVar5 = x;
  if (uVar4 == this->m_capacity) {
    if (((int)uVar4 < 8) || ((ulong)((long)(int)uVar4 * 0x14) < 0x10000001)) {
      uVar7 = 4;
      if (2 < (int)uVar4) {
        uVar7 = uVar4 * 2;
      }
    }
    else {
      uVar7 = 0xccccd4;
      if (uVar4 < 0xccccd4) {
        uVar7 = uVar4;
      }
      uVar7 = uVar7 + uVar4;
    }
    if (x < this->m_a + (int)uVar4 && this->m_a <= x) {
      pOVar5 = (ON_UuidIndex *)onmalloc(0x14);
      pOVar5->m_i = x->m_i;
      uVar2 = (x->m_id).Data2;
      uVar3 = (x->m_id).Data3;
      uVar1 = *(undefined8 *)(x->m_id).Data4;
      (pOVar5->m_id).Data1 = (x->m_id).Data1;
      (pOVar5->m_id).Data2 = uVar2;
      (pOVar5->m_id).Data3 = uVar3;
      *(undefined8 *)(pOVar5->m_id).Data4 = uVar1;
      uVar4 = this->m_capacity;
    }
    if (uVar4 < uVar7) {
      SetCapacity(this,(long)(int)uVar7);
    }
    pOVar6 = this->m_a;
    if (pOVar6 == (ON_UuidIndex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar4 = this->m_count;
  }
  else {
    pOVar6 = this->m_a;
  }
  this->m_count = uVar4 + 1;
  pOVar6[(int)uVar4].m_i = pOVar5->m_i;
  uVar2 = (pOVar5->m_id).Data2;
  uVar3 = (pOVar5->m_id).Data3;
  uVar1 = *(undefined8 *)(pOVar5->m_id).Data4;
  pOVar6 = pOVar6 + (int)uVar4;
  (pOVar6->m_id).Data1 = (pOVar5->m_id).Data1;
  (pOVar6->m_id).Data2 = uVar2;
  (pOVar6->m_id).Data3 = uVar3;
  *(undefined8 *)(pOVar6->m_id).Data4 = uVar1;
  if (pOVar5 != x) {
    onfree(pOVar5);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}